

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpeg2StreamReader.cpp
# Opt level: O0

int __thiscall MPEG2StreamReader::intDecodeNAL(MPEG2StreamReader *this,uint8_t *buff)

{
  uint8_t uVar1;
  int iVar2;
  BitStreamException *e;
  uint8_t *local_30;
  uint8_t *nextNal;
  int rez;
  uint8_t *buff_local;
  MPEG2StreamReader *this_local;
  
  uVar1 = *buff;
  if (uVar1 == '\0') {
    this_local._4_4_ = decodePicture(this,buff);
  }
  else if (uVar1 == 0xb3) {
    this_local._4_4_ = processSeqStartCode(this,buff);
    if (this_local._4_4_ == 0) {
      for (local_30 = MPEGHeader::findNextMarker
                                (buff,(this->super_MPEGStreamReader).super_AbstractStreamReader.
                                      m_bufEnd); local_30 = local_30 + 3,
          local_30 < (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd;
          local_30 = MPEGHeader::findNextMarker
                               (local_30,(this->super_MPEGStreamReader).super_AbstractStreamReader.
                                         m_bufEnd)) {
        uVar1 = *local_30;
        if (uVar1 == '\0') {
          iVar2 = decodePicture(this,local_30);
          if (iVar2 != 0) {
            return iVar2;
          }
          (this->super_MPEGStreamReader).m_lastDecodedPos = local_30;
          return 0;
        }
        if (uVar1 == 0xb5) {
          iVar2 = processExtStartCode(this,local_30);
          if (iVar2 != 0) {
            return iVar2;
          }
        }
        else if (uVar1 == 0xb8) {
          this->m_framesAtGop = -1;
          *(undefined4 *)&(this->super_MPEGStreamReader).field_0xdc = 0xffffffff;
        }
      }
      this_local._4_4_ = -10;
    }
  }
  else if (uVar1 == 0xb5) {
    this_local._4_4_ = processExtStartCode(this,buff);
  }
  else {
    if (uVar1 == 0xb8) {
      this->m_framesAtGop = -1;
      *(undefined4 *)&(this->super_MPEGStreamReader).field_0xdc = 0xffffffff;
    }
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int MPEG2StreamReader::intDecodeNAL(uint8_t* buff)
{
    try
    {
        int rez;
        uint8_t* nextNal;
        switch (*buff)
        {
        case SEQ_START_SHORT_CODE:
            rez = processSeqStartCode(buff);
            if (rez != 0)
                return rez;
            nextNal = MPEGHeader::findNextMarker(buff, m_bufEnd) + 3;
            while (true)
            {
                if (nextNal >= m_bufEnd)
                    return NOT_ENOUGH_BUFFER;
                switch (*nextNal)
                {
                case EXT_START_SHORT_CODE:
                    rez = processExtStartCode(nextNal);
                    if (rez != 0)
                        return rez;
                    break;
                case GOP_START_SHORT_CODE:
                    m_framesAtGop = -1;
                    m_lastRef = -1;
                    break;
                case PICTURE_START_SHORT_CODE:
                    rez = decodePicture(nextNal);
                    if (rez == 0)
                    {
                        m_lastDecodedPos = nextNal;
                    }
                    return rez;
                default:;
                }
                nextNal = MPEGHeader::findNextMarker(nextNal, m_bufEnd) + 3;
            }
        case EXT_START_SHORT_CODE:
            return processExtStartCode(buff);
        case GOP_START_SHORT_CODE:
            m_framesAtGop = -1;
            m_lastRef = -1;
            break;
        case PICTURE_START_SHORT_CODE:
            rez = decodePicture(buff);
            return rez;
        default:;
        }
        return 0;
    }
    catch (BitStreamException& e)
    {
        (void)e;
        return NOT_ENOUGH_BUFFER;
    }
}